

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util.cc
# Opt level: O1

int __thiscall
ctemplate::TemplateDictionaryPeer::GetSectionDictionaries
          (TemplateDictionaryPeer *this,TemplateString *section_name,
          vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
          *dicts)

{
  pointer *pppTVar1;
  pointer ppTVar2;
  iterator __position;
  char cVar3;
  int iVar4;
  long *plVar5;
  TemplateDictionary *local_20;
  
  ppTVar2 = (dicts->
            super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((dicts->
      super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppTVar2) {
    (dicts->
    super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
    )._M_impl.super__Vector_impl_data._M_finish = ppTVar2;
  }
  cVar3 = (**(code **)(*(long *)this->dict_ + 0x18))(this->dict_,section_name);
  iVar4 = 0;
  if (cVar3 == '\0') {
    plVar5 = (long *)(**(code **)(*(long *)this->dict_ + 0x40))(this->dict_,section_name);
    cVar3 = (**(code **)(*plVar5 + 0x10))(plVar5);
    if (cVar3 != '\0') {
      do {
        local_20 = (TemplateDictionary *)(**(code **)(*plVar5 + 0x18))(plVar5);
        __position._M_current =
             (dicts->
             super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (dicts->
            super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<ctemplate::TemplateDictionary_const*,std::allocator<ctemplate::TemplateDictionary_const*>>
          ::_M_realloc_insert<ctemplate::TemplateDictionary_const*>
                    ((vector<ctemplate::TemplateDictionary_const*,std::allocator<ctemplate::TemplateDictionary_const*>>
                      *)dicts,__position,&local_20);
        }
        else {
          *__position._M_current = local_20;
          pppTVar1 = &(dicts->
                      super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppTVar1 = *pppTVar1 + 1;
        }
        cVar3 = (**(code **)(*plVar5 + 0x10))(plVar5);
      } while (cVar3 != '\0');
    }
    (**(code **)(*plVar5 + 8))(plVar5);
    iVar4 = (int)((ulong)((long)(dicts->
                                super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(dicts->
                               super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                               )._M_impl.super__Vector_impl_data._M_start) >> 3);
  }
  return iVar4;
}

Assistant:

int TemplateDictionaryPeer::GetSectionDictionaries(
    const TemplateString& section_name,
    vector<const TemplateDictionary*>* dicts) const {
  dicts->clear();
  if (dict_->IsHiddenSection(section_name))
    return 0;

  TemplateDictionaryInterface::Iterator* di =
      dict_->CreateSectionIterator(section_name);
  while (di->HasNext())
    dicts->push_back(down_cast<const TemplateDictionary*>(&di->Next()));
  delete di;

  return static_cast<int>(dicts->size());
}